

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O3

bool __thiscall Matrix::bShapeEqual(Matrix *this,Matrix *m)

{
  bool bVar1;
  ostream *poVar2;
  int iVar3;
  long lVar4;
  
  iVar3 = this->nMatrixDimension;
  if (iVar3 == m->nMatrixDimension) {
    if (iVar3 < 1) {
      bVar1 = true;
    }
    else {
      bVar1 = true;
      lVar4 = 0;
      do {
        if (this->pSize[lVar4] != m->pSize[lVar4]) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"error: size mismatch at dimension ",0x22);
          poVar2 = (ostream *)std::ostream::operator<<(&std::cout,(int)lVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2," in matrix operation ",0x15);
          std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
          std::ostream::put((char)poVar2);
          std::ostream::flush();
          iVar3 = this->nMatrixDimension;
          bVar1 = false;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < iVar3);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"error: dimensionality mismatch in matrix operation ",0x33);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Matrix::bShapeEqual( const Matrix &m )
{
	bool ok = true;
	// check shape
	if( nMatrixDimension != m.nMatrixDimension ) {
		cout << "error: dimensionality mismatch in matrix operation " << endl;
		ok = false;
	} else {
		for(int i=0; i<nMatrixDimension; i++)
			if( pSize[i] != m.pSize[i] ) {
				cout << "error: size mismatch at dimension " << i << " in matrix operation " << endl;
				ok = false;
			}
	}
	return ok;
}